

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

type __thiscall
robin_hood::detail::
Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::FontFamily,std::default_delete<Rml::FontFamily>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::
doCreateByKey<std::__cxx11::string_const&,std::unique_ptr<Rml::FontFamily,std::default_delete<Rml::FontFamily>>>
          (Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::FontFamily,std::default_delete<Rml::FontFamily>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  byte *pbVar1;
  char *pcVar2;
  byte bVar3;
  int iVar4;
  FontFamily *__n;
  pointer pcVar5;
  bool bVar6;
  __uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_> __p;
  int iVar7;
  type in_RAX;
  size_t sVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  string *this_00;
  ulong insertion_idx;
  long *local_68 [2];
  long local_58 [2];
  __uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_> local_48;
  type local_40;
  pointer local_38;
  
  do {
    local_40 = in_RAX;
    sVar8 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
            ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                          *)this,key);
    uVar10 = ((uint)sVar8 & 0x1f) >> ((byte)this[0x2c] & 0x3f);
    iVar4 = *(int *)(this + 0x28);
    insertion_idx = sVar8 >> 5 & *(ulong *)(this + 0x18);
    lVar11 = *(long *)(this + 8);
    bVar3 = *(byte *)(lVar11 + insertion_idx);
    while (uVar10 = uVar10 + iVar4, uVar10 < bVar3) {
      pbVar1 = (byte *)(lVar11 + 1 + insertion_idx);
      insertion_idx = insertion_idx + 1;
      bVar3 = *pbVar1;
    }
    if (uVar10 == *(byte *)(lVar11 + insertion_idx)) {
      local_38 = (key->_M_dataplus)._M_p;
      __n = (FontFamily *)key->_M_string_length;
      in_RAX = (type)(*(long *)this + insertion_idx * 0x28 + 0x20);
      do {
        if (__n == in_RAX[-3]._M_t.
                   super___uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>.
                   super__Head_base<0UL,_Rml::FontFamily_*,_false>._M_head_impl) {
          bVar6 = true;
          if (__n == (FontFamily *)0x0) goto LAB_002d11af;
          iVar7 = bcmp(local_38,in_RAX[-4]._M_t.
                                super___uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>
                                .super__Head_base<0UL,_Rml::FontFamily_*,_false>._M_head_impl,
                       (size_t)__n);
          if (iVar7 == 0) goto LAB_002d11ad;
        }
        uVar10 = uVar10 + iVar4;
        pbVar1 = (byte *)(lVar11 + 1 + insertion_idx);
        insertion_idx = insertion_idx + 1;
        in_RAX = in_RAX + 5;
      } while (uVar10 == *pbVar1);
    }
    if (*(ulong *)(this + 0x10) < *(ulong *)(this + 0x20)) {
      if (0xff < iVar4 + uVar10) {
        *(undefined8 *)(this + 0x20) = 0;
      }
      lVar9 = 1;
      do {
        lVar9 = lVar9 + -1;
        pcVar2 = (char *)(lVar11 + insertion_idx);
        lVar11 = lVar11 + 1;
      } while (*pcVar2 != '\0');
      this_00 = (string *)(insertion_idx * 0x28 + *(long *)this);
      if (lVar9 == 0) {
        *(string **)this_00 = this_00 + 0x10;
        pcVar5 = (key->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>(this_00,pcVar5,pcVar5 + key->_M_string_length);
        *(undefined8 *)(this_00 + 0x20) = 0;
      }
      else {
        Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::shiftUp((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this,insertion_idx - lVar9,insertion_idx);
        local_68[0] = local_58;
        pcVar5 = (key->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_68,pcVar5,pcVar5 + key->_M_string_length);
        local_48._M_t.
        super__Tuple_impl<0UL,_Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>.
        super__Head_base<0UL,_Rml::FontFamily_*,_false>._M_head_impl =
             (tuple<Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>)
             (_Tuple_impl<0UL,_Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>)0x0;
        std::__cxx11::string::operator=(this_00,(string *)local_68);
        __p._M_t.super__Tuple_impl<0UL,_Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>.
        super__Head_base<0UL,_Rml::FontFamily_*,_false>._M_head_impl =
             local_48._M_t.
             super__Tuple_impl<0UL,_Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>.
             super__Head_base<0UL,_Rml::FontFamily_*,_false>._M_head_impl;
        local_48._M_t.
        super__Tuple_impl<0UL,_Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>.
        super__Head_base<0UL,_Rml::FontFamily_*,_false>._M_head_impl =
             (tuple<Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>)
             (_Tuple_impl<0UL,_Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>)0x0;
        std::__uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>::reset
                  ((__uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_> *)
                   (this_00 + 0x20),
                   (pointer)__p._M_t.
                            super__Tuple_impl<0UL,_Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>
                            .super__Head_base<0UL,_Rml::FontFamily_*,_false>._M_head_impl);
        std::unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>::~unique_ptr
                  ((unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_> *)&local_48);
        if (local_68[0] != local_58) {
          operator_delete(local_68[0],local_58[0] + 1);
        }
      }
      *(char *)(*(long *)(this + 8) + insertion_idx) = (char)uVar10;
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      in_RAX = (type)(*(long *)this + insertion_idx * 0x28 + 0x20);
LAB_002d11ad:
      bVar6 = true;
    }
    else {
      Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::increase_size((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this);
      bVar6 = false;
      in_RAX = local_40;
    }
LAB_002d11af:
    if (bVar6) {
      return in_RAX;
    }
  } while( true );
}

Assistant:

typename std::enable_if<!std::is_void<Q>::value, Q&>::type doCreateByKey(Arg&& key) {
        while (true) {
            size_t idx{};
            InfoType info{};
            keyToIdx(key, &idx, &info);
            nextWhileLess(&info, &idx);

            // while we potentially have a match. Can't do a do-while here because when mInfo is
            // 0 we don't want to skip forward
            while (info == mInfo[idx]) {
                if (WKeyEqual::operator()(key, mKeyVals[idx].getFirst())) {
                    // key already exists, do not insert.
                    return mKeyVals[idx].getSecond();
                }
                next(&info, &idx);
            }

            // unlikely that this evaluates to true
            if (ROBIN_HOOD_UNLIKELY(mNumElements >= mMaxNumElementsAllowed)) {
                increase_size();
                continue;
            }

            // key not found, so we are now exactly where we want to insert it.
            auto const insertion_idx = idx;
            auto const insertion_info = info;
            if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }

            // find an empty spot
            while (0 != mInfo[idx]) {
                next(&info, &idx);
            }

            auto& l = mKeyVals[insertion_idx];
            if (idx == insertion_idx) {
                // put at empty spot. This forwards all arguments into the node where the object
                // is constructed exactly where it is needed.
                ::new (static_cast<void*>(&l))
                    Node(*this, std::piecewise_construct,
                         std::forward_as_tuple(std::forward<Arg>(key)), std::forward_as_tuple());
            } else {
                shiftUp(idx, insertion_idx);
                l = Node(*this, std::piecewise_construct,
                         std::forward_as_tuple(std::forward<Arg>(key)), std::forward_as_tuple());
            }

            // mKeyVals[idx].getFirst() = std::move(key);
            mInfo[insertion_idx] = static_cast<uint8_t>(insertion_info);

            ++mNumElements;
            return mKeyVals[insertion_idx].getSecond();
        }
    }